

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluCheckGroup(word *pTruth,int nVars,If_Grp_t *g)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int nVars_00;
  int P2V [16];
  int V2P [16];
  word pF [1024];
  
  if (4 < (byte)(g->nVars - 2U)) {
    __assert_fail("g->nVars >= 2 && g->nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x590,"void If_CluCheckGroup(word *, int, If_Grp_t *)");
  }
  if ((byte)(g->nMyu - 2U) < 3) {
    uVar2 = 0;
    uVar3 = 0;
    if (0 < nVars) {
      uVar3 = (ulong)(uint)nVars;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      P2V[uVar2] = (int)uVar2;
      V2P[uVar2] = (int)uVar2;
    }
    If_CluCopy(pF,pTruth,nVars);
    If_CluMoveGroupToMsb(pF,nVars,V2P,P2V,g);
    iVar1 = If_CluCountCofs(pF,nVars,(int)g->nVars,0,(word (*) [256])0x0);
    if (iVar1 != g->nMyu) {
      puts("Group check 0 has failed.");
    }
    if (2 < iVar1) {
      nVars_00 = nVars + -1;
      iVar1 = If_CluCountCofs(pF,nVars_00,g->nVars + -1,0,(word (*) [256])0x0);
      if (2 < iVar1) {
        puts("Group check 1 has failed.");
      }
      iVar1 = If_CluCountCofs(pF,nVars_00,g->nVars + -1,1 << ((byte)nVars_00 & 0x1f),
                              (word (*) [256])0x0);
      if (2 < iVar1) {
        puts("Group check 2 has failed.");
        return;
      }
    }
    return;
  }
  __assert_fail("g->nMyu >= 2 && g->nMyu <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x591,"void If_CluCheckGroup(word *, int, If_Grp_t *)");
}

Assistant:

void If_CluCheckGroup( word * pTruth, int nVars, If_Grp_t * g )
{
    word pF[CLU_WRD_MAX];
    int v, nCofs, V2P[CLU_VAR_MAX], P2V[CLU_VAR_MAX];
    assert( g->nVars >= 2 && g->nVars <= 6 ); // vars
    assert( g->nMyu >= 2 && g->nMyu <= 4 ); // cofs
    // create permutation
    for ( v = 0; v < nVars; v++ )
        V2P[v] = P2V[v] = v;
    // create truth table
    If_CluCopy( pF, pTruth, nVars );
    // move group up
    If_CluMoveGroupToMsb( pF, nVars, V2P, P2V, g );
    // check the number of cofactors
    nCofs = If_CluCountCofs( pF, nVars, g->nVars, 0, NULL );
    if ( nCofs != g->nMyu )
        printf( "Group check 0 has failed.\n" );
    // check compatible
    if ( nCofs > 2 )
    {
        nCofs = If_CluCountCofs( pF, nVars-1, g->nVars-1, 0, NULL );
        if ( nCofs > 2 )
            printf( "Group check 1 has failed.\n" );
        nCofs = If_CluCountCofs( pF, nVars-1, g->nVars-1, (1 << (nVars-1)), NULL );
        if ( nCofs > 2 )
            printf( "Group check 2 has failed.\n" );
    }
}